

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::api::json::DecodePsbtUtxo::DecodePsbtUtxo(DecodePsbtUtxo *this)

{
  JsonClassBase<cfd::api::json::DecodePsbtUtxo> *in_RDI;
  
  core::JsonClassBase<cfd::api::json::DecodePsbtUtxo>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodePsbtUtxo_009f8b98;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x663a15);
  in_RDI[7]._vptr_JsonClassBase = (_func_int **)0x0;
  DecodePsbtLockingScript::DecodePsbtLockingScript((DecodePsbtLockingScript *)this);
  CollectFieldName();
  return;
}

Assistant:

DecodePsbtUtxo() {
    CollectFieldName();
  }